

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall vector<vector<vector<int>_>_>::vector(vector<vector<vector<int>_>_> *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new__(0x18);
  *puVar1 = 1;
  vector<vector<int>_>::vector((vector<vector<int>_> *)(puVar1 + 1));
  this->vect = (vector<vector<int>_> *)(puVar1 + 1);
  this->_size = 0;
  this->_capacity = 1;
  return;
}

Assistant:

vector() {
        vect = new T[1]();
        _size = 0;
        _capacity = 1;
    }